

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::standard_library::sequence_type<std::__cxx11::string>
                    (string *param_1,ModulePtr *m)

{
  element_type *__r;
  Proxy_Function *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ModulePtr MVar1;
  string *in_stack_ffffffffffffff40;
  string *name;
  element_type *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff68;
  string local_90 [72];
  string local_48 [72];
  
  this = in_RDI;
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f1f3e);
  fun<void,std::__cxx11::string&,int,char_const&>
            ((_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int_char_ptr
              *)in_RDX);
  sequence_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)
  ::{lambda()#1}::operator()[abi_cxx11_(in_stack_ffffffffffffff68);
  Module::add(this,in_RDX,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_48);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3f1fa1);
  __r = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3f1fab);
  fun<void,std::__cxx11::string&,int>
            ((_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int *
             )in_RDX);
  name = (string *)&stack0xffffffffffffff6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"erase_at",(allocator *)name);
  Module::add(this,in_RDX,name);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3f201a);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)name,(shared_ptr<chaiscript::Module> *)__r);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr sequence_type(const std::string &/*type*/, ModulePtr m = std::make_shared<Module>())
        {
          m->add(fun(&detail::insert_at<ContainerType>), 
              []()->std::string{
                if (typeid(typename ContainerType::value_type) == typeid(Boxed_Value)) {
                  return "insert_ref_at";
                } else {
                  return "insert_at";
                }
              }());

          m->add(fun(&detail::erase_at<ContainerType>), "erase_at");

          return m;
        }